

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.c
# Opt level: O3

void screen_byte_1(ubyte iobyte,uint address)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int i1;
  uint cord;
  uint uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort i;
  uint uVar10;
  uint uVar11;
  uint i1_00;
  
  uVar3 = (ushort)(address - ram_screen_start) ^ 0xffff8000;
  if (screen_start <= address) {
    uVar3 = (uint)address;
  }
  uVar3 = uVar3 - screen_start;
  uVar2 = (uVar3 & 7) + ((uVar3 & 0xffff) / ((uint)crt_regs[1] << 3)) * 8;
  cord = (short)((uVar2 & 0xffff) >> 2) + (short)uVar2;
  uVar9 = (ushort)((uVar3 & 0xffff) % ((uint)crt_regs[1] << 3));
  if (crt_regs[1] == 'P') {
    uVar8 = uVar9 & 0x3f8;
    uVar2 = (uint)(iobyte >> 4 & 8);
    putpixel(uVar8,cord,uVar2);
    uVar4 = iobyte >> 3 & 8;
    putpixel(uVar8 + 1,cord,uVar4);
    i1_00 = iobyte >> 2 & 8;
    putpixel(uVar8 + 2,cord,i1_00);
    uVar10 = iobyte >> 1 & 8;
    putpixel(uVar8 + 3,cord,uVar10);
    uVar11 = (uint)iobyte;
    putpixel(uVar8 + 4,cord,uVar11 & 8);
    uVar5 = iobyte + uVar11 & 8;
    putpixel(uVar8 + 5,cord,uVar5);
    uVar6 = uVar11 * 4 & 8;
    putpixel(uVar8 + 6,cord,uVar6);
    i1 = (iobyte & 1) << 3;
    putpixel(uVar9 | 7,cord,i1);
    if ((uVar3 & 3) != 0) {
      return;
    }
    uVar7 = cord - 1;
    putpixel(uVar8,uVar7,uVar2);
    putpixel(uVar8 + 1,uVar7,uVar4);
    putpixel(uVar8 + 2,uVar7,i1_00);
    putpixel(uVar8 + 3,uVar7,uVar10);
    putpixel(uVar8 + 4,uVar7,uVar11 & 8);
    putpixel(uVar8 + 5,uVar7,uVar5);
    putpixel(uVar8 + 6,uVar7,uVar6);
    uVar9 = uVar9 | 7;
  }
  else {
    uVar8 = uVar9 * 2;
    i = uVar8 & 0xff0;
    bVar1 = iobyte >> 4 & 8;
    putpixel(i,cord,(uint)bVar1);
    putpixel(i + 1,cord,(uint)bVar1);
    uVar2 = iobyte >> 3 & 8;
    putpixel(i + 2,cord,uVar2);
    putpixel(i + 3,cord,uVar2);
    uVar4 = iobyte >> 2 & 8;
    putpixel(i + 4,cord,uVar4);
    putpixel(i + 5,cord,uVar4);
    uVar11 = iobyte >> 1 & 8;
    putpixel(i + 6,cord,uVar11);
    putpixel(i + 7,cord,uVar11);
    uVar6 = (uint)iobyte;
    uVar5 = uVar6 & 8;
    putpixel(i + 8,cord,uVar5);
    putpixel(i + 9,cord,uVar5);
    uVar10 = iobyte + uVar6 & 8;
    putpixel(i + 10,cord,uVar10);
    putpixel(i + 0xb,cord,uVar10);
    uVar6 = uVar6 * 4 & 8;
    putpixel(i + 0xc,cord,uVar6);
    putpixel(i + 0xd,cord,uVar6);
    i1 = (iobyte & 1) << 3;
    putpixel(uVar8 | 0xe,cord,i1);
    uVar9 = uVar8 | 0xf;
    putpixel(uVar9,cord,i1);
    if ((uVar3 & 3) != 0) {
      return;
    }
    uVar7 = cord - 1;
    putpixel(i,uVar7,(uint)bVar1);
    putpixel(i + 1,uVar7,(uint)bVar1);
    putpixel(i + 2,uVar7,uVar2);
    putpixel(i + 3,uVar7,uVar2);
    putpixel(i + 4,uVar7,uVar4);
    putpixel(i + 5,uVar7,uVar4);
    putpixel(i + 6,uVar7,uVar11);
    putpixel(i + 7,uVar7,uVar11);
    putpixel(i + 8,uVar7,uVar5);
    putpixel(i + 9,uVar7,uVar5);
    putpixel(i + 10,uVar7,uVar10);
    putpixel(i + 0xb,uVar7,uVar10);
    putpixel(i + 0xc,uVar7,uVar6);
    putpixel(i + 0xd,uVar7,uVar6);
    putpixel(uVar8 | 0xe,uVar7,i1);
  }
  putpixel(uVar9,cord - 1,i1);
  return;
}

Assistant:

void screen_byte_1(ubyte iobyte, uint address) {
    uint x_cord = 0;                 // init real x cordinate variable
    uint y_cord = 0;                 // init real y cordinate variable
    uint virt_y_cord = 0;            // init actual pc output y coordinate
    uint bitsperline;              // variable holding bits per line

    // deal with hardware wrap-around
    if (address < screen_start) address += (0x8000 - ram_screen_start);
    address -= screen_start;
    bitsperline = crt_regs[1] << 3;    // calculate bits per line

    y_cord = address / (bitsperline);  // calculate character row of address
    y_cord *= 8;                     // convert to pixel row
    y_cord += (address % 8);           // add fraction of character to pixel row

    virt_y_cord += y_cord + y_cord / 4;  // scale output to pc screen

    x_cord = address % (bitsperline);  // calculate x coordinate
    x_cord &= 0xFFF8;                // mask off lower 3 bits

    if (bitsperline == 640)          // if an 80 character mode
    {
        putpixel(x_cord + 0, virt_y_cord, (iobyte & 0x80) ? 8 : 0);
        putpixel(x_cord + 1, virt_y_cord, (iobyte & 0x40) ? 8 : 0);
        putpixel(x_cord + 2, virt_y_cord, (iobyte & 0x20) ? 8 : 0);
        putpixel(x_cord + 3, virt_y_cord, (iobyte & 0x10) ? 8 : 0);
        putpixel(x_cord + 4, virt_y_cord, (iobyte & 0x08) ? 8 : 0);
        putpixel(x_cord + 5, virt_y_cord, (iobyte & 0x04) ? 8 : 0);
        putpixel(x_cord + 6, virt_y_cord, (iobyte & 0x02) ? 8 : 0);
        putpixel(x_cord + 7, virt_y_cord, (iobyte & 0x01) ? 8 : 0);
    }

    else                           // if not an 80 character mode
    {
        x_cord <<= 1;                    // scale output to fit pc screen
        putpixel(x_cord + 0, virt_y_cord, (iobyte & 0x80) ? 8 : 0);
        putpixel(x_cord + 1, virt_y_cord, (iobyte & 0x80) ? 8 : 0);
        putpixel(x_cord + 2, virt_y_cord, (iobyte & 0x40) ? 8 : 0);
        putpixel(x_cord + 3, virt_y_cord, (iobyte & 0x40) ? 8 : 0);
        putpixel(x_cord + 4, virt_y_cord, (iobyte & 0x20) ? 8 : 0);
        putpixel(x_cord + 5, virt_y_cord, (iobyte & 0x20) ? 8 : 0);
        putpixel(x_cord + 6, virt_y_cord, (iobyte & 0x10) ? 8 : 0);
        putpixel(x_cord + 7, virt_y_cord, (iobyte & 0x10) ? 8 : 0);
        putpixel(x_cord + 8, virt_y_cord, (iobyte & 0x08) ? 8 : 0);
        putpixel(x_cord + 9, virt_y_cord, (iobyte & 0x08) ? 8 : 0);
        putpixel(x_cord + 10, virt_y_cord, (iobyte & 0x04) ? 8 : 0);
        putpixel(x_cord + 11, virt_y_cord, (iobyte & 0x04) ? 8 : 0);
        putpixel(x_cord + 12, virt_y_cord, (iobyte & 0x02) ? 8 : 0);
        putpixel(x_cord + 13, virt_y_cord, (iobyte & 0x02) ? 8 : 0);
        putpixel(x_cord + 14, virt_y_cord, (iobyte & 0x01) ? 8 : 0);
        putpixel(x_cord + 15, virt_y_cord, (iobyte & 0x01) ? 8 : 0);
    }


    if (!(y_cord & 3))               // if the vertical coordinate has been scaled
    {
        virt_y_cord--;                 // file in the extra pixels

        if (bitsperline == 640)          // if an 80 character mode
        {
            putpixel(x_cord + 0, virt_y_cord, (iobyte & 0x80) ? 8 : 0);
            putpixel(x_cord + 1, virt_y_cord, (iobyte & 0x40) ? 8 : 0);
            putpixel(x_cord + 2, virt_y_cord, (iobyte & 0x20) ? 8 : 0);
            putpixel(x_cord + 3, virt_y_cord, (iobyte & 0x10) ? 8 : 0);
            putpixel(x_cord + 4, virt_y_cord, (iobyte & 0x08) ? 8 : 0);
            putpixel(x_cord + 5, virt_y_cord, (iobyte & 0x04) ? 8 : 0);
            putpixel(x_cord + 6, virt_y_cord, (iobyte & 0x02) ? 8 : 0);
            putpixel(x_cord + 7, virt_y_cord, (iobyte & 0x01) ? 8 : 0);
        }

        else                           // if not an 80 character mode
        {
            putpixel(x_cord + 0, virt_y_cord, (iobyte & 0x80) ? 8 : 0);
            putpixel(x_cord + 1, virt_y_cord, (iobyte & 0x80) ? 8 : 0);
            putpixel(x_cord + 2, virt_y_cord, (iobyte & 0x40) ? 8 : 0);
            putpixel(x_cord + 3, virt_y_cord, (iobyte & 0x40) ? 8 : 0);
            putpixel(x_cord + 4, virt_y_cord, (iobyte & 0x20) ? 8 : 0);
            putpixel(x_cord + 5, virt_y_cord, (iobyte & 0x20) ? 8 : 0);
            putpixel(x_cord + 6, virt_y_cord, (iobyte & 0x10) ? 8 : 0);
            putpixel(x_cord + 7, virt_y_cord, (iobyte & 0x10) ? 8 : 0);
            putpixel(x_cord + 8, virt_y_cord, (iobyte & 0x08) ? 8 : 0);
            putpixel(x_cord + 9, virt_y_cord, (iobyte & 0x08) ? 8 : 0);
            putpixel(x_cord + 10, virt_y_cord, (iobyte & 0x04) ? 8 : 0);
            putpixel(x_cord + 11, virt_y_cord, (iobyte & 0x04) ? 8 : 0);
            putpixel(x_cord + 12, virt_y_cord, (iobyte & 0x02) ? 8 : 0);
            putpixel(x_cord + 13, virt_y_cord, (iobyte & 0x02) ? 8 : 0);
            putpixel(x_cord + 14, virt_y_cord, (iobyte & 0x01) ? 8 : 0);
            putpixel(x_cord + 15, virt_y_cord, (iobyte & 0x01) ? 8 : 0);
        }

    }

}